

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::generateNumberingSystemOption
               (NumberingSystem *ns,UnicodeString *sb,UErrorCode *param_3)

{
  char *src;
  UnicodeString local_60;
  UErrorCode *local_20;
  UErrorCode *param_2_local;
  UnicodeString *sb_local;
  NumberingSystem *ns_local;
  
  local_20 = param_3;
  param_2_local = (UErrorCode *)sb;
  sb_local = (UnicodeString *)ns;
  src = NumberingSystem::getName(ns);
  UnicodeString::UnicodeString(&local_60,src,-1,kInvariant);
  UnicodeString::append(sb,&local_60);
  UnicodeString::~UnicodeString(&local_60);
  return;
}

Assistant:

void blueprint_helpers::generateNumberingSystemOption(const NumberingSystem& ns, UnicodeString& sb,
                                                      UErrorCode&) {
    // Need to do char <-> UChar conversion...
    sb.append(UnicodeString(ns.getName(), -1, US_INV));
}